

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

int QMessageBoxPrivate::showOldMessageBox
              (QWidget *parent,Icon icon,QString *title,QString *text,QString *button0Text,
              QString *button1Text,QString *button2Text,int defaultButtonNumber,
              int escapeButtonNumber)

{
  long *plVar1;
  char16_t *pcVar2;
  QArrayData *pQVar3;
  Data *pDVar4;
  undefined1 *puVar5;
  int iVar6;
  QPushButton *button;
  QAbstractButton *button_00;
  long lVar7;
  long in_FS_OFFSET;
  QMessageBox messageBox;
  QArrayData *local_88;
  char16_t *pcStack_80;
  long local_78;
  QString local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QWidgetData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QMessageBox::QMessageBox
            ((QMessageBox *)&local_48,icon,title,text,(StandardButtons)0x0,parent,(WindowFlags)0x103
            );
  local_68.d.d = (button0Text->d).d;
  local_68.d.ptr = (button0Text->d).ptr;
  local_68.d.size = (button0Text->d).size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_68.d.size == 0) {
    QMetaObject::tr((char *)&local_88,(char *)&QDialogButtonBox::staticMetaObject,0x6e4cd2);
    pcVar2 = local_68.d.ptr;
    pDVar4 = local_68.d.d;
    pQVar3 = local_88;
    local_88 = &(local_68.d.d)->super_QArrayData;
    local_68.d.d = (Data *)pQVar3;
    local_68.d.ptr = pcStack_80;
    pcStack_80 = pcVar2;
    local_68.d.size = local_78;
    local_78 = 0;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
  }
  QMessageBox::addButton((QMessageBox *)&local_48,&local_68,ActionRole);
  if ((button1Text->d).size != 0) {
    QMessageBox::addButton((QMessageBox *)&local_48,button1Text,ActionRole);
  }
  if ((button2Text->d).size != 0) {
    QMessageBox::addButton((QMessageBox *)&local_48,button2Text,ActionRole);
  }
  puVar5 = puStack_40;
  if ((ulong)(long)defaultButtonNumber < *(ulong *)(puStack_40 + 0x310)) {
    button = *(QPushButton **)(*(long *)(puStack_40 + 0x308) + (long)defaultButtonNumber * 8);
  }
  else {
    button = (QPushButton *)0x0;
  }
  QMessageBox::setDefaultButton((QMessageBox *)&local_48,button);
  if ((ulong)(long)escapeButtonNumber < *(ulong *)(puVar5 + 0x310)) {
    button_00 = *(QAbstractButton **)(*(long *)(puVar5 + 0x308) + (long)escapeButtonNumber * 8);
  }
  else {
    button_00 = (QAbstractButton *)0x0;
  }
  QMessageBox::setEscapeButton((QMessageBox *)&local_48,button_00);
  QDialog::exec((QDialog *)&local_48);
  if (*(long *)(puVar5 + 0x310) == 0) {
LAB_0050408a:
    iVar6 = -1;
  }
  else {
    iVar6 = -1;
    lVar7 = 0;
    do {
      if (*(long *)(puVar5 + 0x310) << 3 == lVar7) goto LAB_0050408a;
      iVar6 = iVar6 + 1;
      plVar1 = (long *)(*(long *)(puVar5 + 0x308) + lVar7);
      lVar7 = lVar7 + 8;
    } while (*plVar1 != *(long *)(puStack_40 + 0x330));
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMessageBox::~QMessageBox((QMessageBox *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QMessageBoxPrivate::showOldMessageBox(QWidget *parent, QMessageBox::Icon icon,
                                            const QString &title, const QString &text,
                                            const QString &button0Text,
                                            const QString &button1Text,
                                            const QString &button2Text,
                                            int defaultButtonNumber,
                                            int escapeButtonNumber)
{
    QMessageBox messageBox(icon, title, text, QMessageBox::NoButton, parent);
    QString myButton0Text = button0Text;
    if (myButton0Text.isEmpty())
        myButton0Text = QDialogButtonBox::tr("OK");
    messageBox.addButton(myButton0Text, QMessageBox::ActionRole);
    if (!button1Text.isEmpty())
        messageBox.addButton(button1Text, QMessageBox::ActionRole);
    if (!button2Text.isEmpty())
        messageBox.addButton(button2Text, QMessageBox::ActionRole);

    const QList<QAbstractButton *> &buttonList = messageBox.d_func()->customButtonList;
    messageBox.setDefaultButton(static_cast<QPushButton *>(buttonList.value(defaultButtonNumber)));
    messageBox.setEscapeButton(buttonList.value(escapeButtonNumber));

    messageBox.exec();

    // Ignore exec return value and use button index instead,
    // as that's what the documentation promises.
    return buttonList.indexOf(messageBox.clickedButton());
}